

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O3

uint32_t __thiscall
cfd::ConfidentialTransactionContext::AddPegoutTxOut
          (ConfidentialTransactionContext *this,Amount *value,ConfidentialAssetId *asset,
          BlockHash *genesisblock_hash,Address *btc_address,NetType bitcoin_net_type,
          Pubkey *online_pubkey,Privkey *master_online_key,string *btc_descriptor,
          uint32_t bip32_counter,ByteData *whitelist,NetType elements_net_type,
          Address *btc_derive_address)

{
  bool bVar1;
  uint32_t uVar2;
  PegoutKeyData key_data;
  undefined1 local_250 [24];
  ByteData local_238;
  ConfidentialTransactionContext *local_218;
  Amount *local_210;
  ConfidentialAssetId *local_208;
  ByteData local_200;
  Script script;
  Script locking_script;
  
  local_218 = this;
  local_210 = value;
  local_208 = asset;
  core::Script::Script(&script);
  core::Pubkey::Pubkey(&key_data.btc_pubkey_bytes);
  core::ByteData::ByteData(&key_data.whitelist_proof);
  bVar1 = core::Pubkey::IsValid(online_pubkey);
  if (bVar1) {
    bVar1 = core::Privkey::IsValid(master_online_key);
    if (bVar1) {
      core::Address::Address((Address *)&locking_script);
      core::ByteData::ByteData(&local_200);
      core::ConfidentialTransaction::GetPegoutPubkeyData
                ((PegoutKeyData *)local_250,online_pubkey,master_online_key,btc_descriptor,
                 bip32_counter,whitelist,bitcoin_net_type,&local_200,elements_net_type,
                 (Address *)&locking_script);
      core::ByteData::operator=((ByteData *)&key_data,(ByteData *)local_250);
      core::ByteData::operator=(&key_data.whitelist_proof,&local_238);
      if (local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_238.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_238.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_238.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_250._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_250._0_8_,local_250._16_8_ - local_250._0_8_);
      }
      if (local_200.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_200.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_200.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_200.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      core::Address::GetAddress_abi_cxx11_((string *)local_250,(Address *)&locking_script);
      if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
        operator_delete((void *)local_250._0_8_,(ulong)(local_250._16_8_ + 1));
      }
      if ((pointer)local_250._8_8_ != (pointer)0x0) {
        core::Address::GetLockingScript((Script *)local_250,(Address *)&locking_script);
        core::Script::operator=(&script,(Script *)local_250);
        core::Script::~Script((Script *)local_250);
        if (btc_derive_address != (Address *)0x0) {
          core::Address::operator=(btc_derive_address,(Address *)&locking_script);
        }
      }
      core::Address::~Address((Address *)&locking_script);
      goto LAB_003ec275;
    }
  }
  core::Address::GetLockingScript(&locking_script,btc_address);
  core::Script::operator=(&script,&locking_script);
  core::Script::~Script(&locking_script);
LAB_003ec275:
  core::ScriptUtil::CreatePegoutLogkingScript
            (&locking_script,genesisblock_hash,&script,&key_data.btc_pubkey_bytes,
             &key_data.whitelist_proof);
  uVar2 = core::ConfidentialTransaction::AddTxOut
                    (&local_218->super_ConfidentialTransaction,local_210,local_208,&locking_script);
  core::Script::~Script(&locking_script);
  if (key_data.whitelist_proof.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(key_data.whitelist_proof.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)key_data.whitelist_proof.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)key_data.whitelist_proof.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (key_data.btc_pubkey_bytes.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(key_data.btc_pubkey_bytes.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)key_data.btc_pubkey_bytes.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)key_data.btc_pubkey_bytes.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  core::Script::~Script(&script);
  return uVar2;
}

Assistant:

uint32_t ConfidentialTransactionContext::AddPegoutTxOut(
    const Amount& value, const ConfidentialAssetId& asset,
    const BlockHash& genesisblock_hash, const Address& btc_address,
    NetType bitcoin_net_type, const Pubkey& online_pubkey,
    const Privkey& master_online_key, const std::string& btc_descriptor,
    uint32_t bip32_counter, const ByteData& whitelist,
    NetType elements_net_type, Address* btc_derive_address) {
  Script script;
  PegoutKeyData key_data;
  if (online_pubkey.IsValid() && master_online_key.IsValid()) {
    // generate pubkey and whitelistproof
    Address derive_addr;
    key_data = ConfidentialTransaction::GetPegoutPubkeyData(
        online_pubkey, master_online_key, btc_descriptor, bip32_counter,
        whitelist, bitcoin_net_type, ByteData(), elements_net_type,
        &derive_addr);
    if (!derive_addr.GetAddress().empty()) {
      script = derive_addr.GetLockingScript();
      if (btc_derive_address != nullptr) {
        *btc_derive_address = derive_addr;
      }
    }
  } else {
    script = btc_address.GetLockingScript();
  }

  Script locking_script = ScriptUtil::CreatePegoutLogkingScript(
      genesisblock_hash, script, key_data.btc_pubkey_bytes,
      key_data.whitelist_proof);
  return AddTxOut(value, asset, locking_script);
}